

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void __thiscall kj::Arena::cleanup(Arena *this,EVP_PKEY_CTX *ctx)

{
  _func_void_void_ptr *p_Var1;
  ChunkHeader *pCVar2;
  ObjectHeader *pOVar3;
  
  pOVar3 = this->objectList;
  while (pOVar3 != (ObjectHeader *)0x0) {
    p_Var1 = pOVar3->destructor;
    this->objectList = pOVar3->next;
    (*p_Var1)(pOVar3 + 1);
    pOVar3 = this->objectList;
  }
  while (pCVar2 = this->chunkList, pCVar2 != (ChunkHeader *)0x0) {
    this->chunkList = pCVar2->next;
    operator_delete(pCVar2);
  }
  return;
}

Assistant:

void Arena::cleanup() {
  while (objectList != nullptr) {
    void* ptr = objectList + 1;
    auto destructor = objectList->destructor;
    objectList = objectList->next;
    destructor(ptr);
  }

  while (chunkList != nullptr) {
    void* ptr = chunkList;
    chunkList = chunkList->next;
    operator delete(ptr);
  }
}